

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_2::DepthFuncTestCase::test(DepthFuncTestCase *this)

{
  uint func;
  long lVar1;
  
  (*this->m_verifier->_vptr_StateVerifier[2])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb74,
             0x201);
  lVar1 = 0;
  ApiCase::expectError(&this->super_ApiCase,0);
  do {
    func = *(uint *)((long)&DAT_01c0ecc0 + lVar1);
    glu::CallLogWrapper::glDepthFunc(&(this->super_ApiCase).super_CallLogWrapper,func);
    ApiCase::expectError(&this->super_ApiCase,0);
    (*this->m_verifier->_vptr_StateVerifier[2])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb74,
               (ulong)func);
    ApiCase::expectError(&this->super_ApiCase,0);
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0x20);
  return;
}

Assistant:

void test (void)
	{
		m_verifier->verifyInteger(m_testCtx, GL_DEPTH_FUNC, GL_LESS);
		expectError(GL_NO_ERROR);

		const GLenum depthFunctions[] = {GL_NEVER, GL_ALWAYS, GL_LESS, GL_LEQUAL, GL_EQUAL, GL_GREATER, GL_GEQUAL, GL_NOTEQUAL};
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(depthFunctions); ndx++)
		{
			glDepthFunc(depthFunctions[ndx]);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, GL_DEPTH_FUNC, depthFunctions[ndx]);
			expectError(GL_NO_ERROR);
		}
	}